

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherInotify.cpp
# Opt level: O1

bool __thiscall efsw::WatcherInotify::inParentTree(WatcherInotify *this,WatcherInotify *parent)

{
  do {
    this = this->Parent;
    if (this == parent) break;
  } while (this != (WatcherInotify *)0x0);
  return this != (WatcherInotify *)0x0;
}

Assistant:

bool WatcherInotify::inParentTree( WatcherInotify * parent )
{
	WatcherInotify * tNext = Parent;

	while ( NULL != tNext )
	{
		if ( tNext == parent )
		{
			return true;
		}

		tNext = tNext->Parent;
	}

	return false;
}